

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_vector.h
# Opt level: O0

void __thiscall wasm::SortedVector::insert(SortedVector *this,Index x)

{
  value_type vVar1;
  bool bVar2;
  reference puVar3;
  difference_type dVar4;
  size_type sVar5;
  iterator __result;
  reference pvVar6;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_70;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_68;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_60;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_58;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_50;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_48;
  uint local_3c;
  iterator iStack_38;
  Index i;
  uint *local_30;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_28;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_20;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> it;
  Index x_local;
  SortedVector *this_local;
  
  it._M_current._4_4_ = x;
  local_28._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
  local_30 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
  local_20 = std::
             lower_bound<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                       (local_28,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                  )local_30,(uint *)((long)&it._M_current + 4));
  iStack_38 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                        (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
  bVar2 = __gnu_cxx::operator==(&local_20,&stack0xffffffffffffffc8);
  if (bVar2) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
               (value_type_conflict2 *)((long)&it._M_current + 4));
  }
  else {
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_20);
    if (it._M_current._4_4_ < *puVar3) {
      local_48._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
      dVar4 = __gnu_cxx::operator-(&local_20,&local_48);
      local_3c = (uint)dVar4;
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,sVar5 + 1);
      local_58._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
      local_50 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator+(&local_58,(ulong)local_3c);
      local_70._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
      local_68 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator+(&local_70,sVar5);
      local_60 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator-(&local_68,1);
      __result = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
      std::
      move_backward<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (local_50,local_60,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )__result._M_current);
      vVar1 = it._M_current._4_4_;
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
                          (ulong)local_3c);
      *pvVar6 = vVar1;
    }
  }
  return;
}

Assistant:

void insert(Index x) {
    auto it = std::lower_bound(begin(), end(), x);
    if (it == end()) {
      push_back(x);
    } else if (*it > x) {
      Index i = it - begin();
      resize(size() + 1);
      std::move_backward(begin() + i, begin() + size() - 1, end());
      (*this)[i] = x;
    }
  }